

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O1

BinaryOperatorTypes *
soul::TypeRules::getTypesForBitwiseOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  Category CVar1;
  Category CVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  ArraySize AVar10;
  ArraySize AVar11;
  Type t_1;
  Type t;
  Type local_58;
  Type local_40;
  PrimitiveType local_24;
  
  if (a->isRef == true) {
    Type::removeReference(&local_58,a);
    getTypesForBitwiseOp(__return_storage_ptr__,&local_58,b);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
  }
  else if (b->isRef == true) {
    Type::removeReference(&local_58,b);
    getTypesForBitwiseOp(__return_storage_ptr__,a,&local_58);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
  }
  else {
    CVar1 = a->category;
    if ((CVar1 & ~primitive) == wrap) {
      local_58.category = primitive;
      local_58.arrayElementCategory = invalid;
      local_58.isRef = false;
      local_58.isConstant = false;
      local_58.primitiveType.type = int32;
      local_58.boundingSize = 0;
      local_58.arrayElementBoundingSize = 0;
      local_58.structure.object = (Structure *)0x0;
      uVar3._0_1_ = b->category;
      uVar3._1_1_ = b->arrayElementCategory;
      uVar3._2_1_ = b->isRef;
      uVar3._3_1_ = b->isConstant;
      uVar5 = b->isConstant;
      uVar6 = b->primitiveType;
      local_40.primitiveType.type = uVar6;
      local_40.isConstant = (bool)uVar5;
      local_40.boundingSize = b->boundingSize;
      local_40.arrayElementBoundingSize = b->arrayElementBoundingSize;
      local_40.structure.object = (b->structure).object;
      if (local_40.structure.object != (Structure *)0x0) {
        ((local_40.structure.object)->super_RefCountedObject).refCount =
             ((local_40.structure.object)->super_RefCountedObject).refCount + 1;
      }
      local_40._0_2_ = SUB42(uVar3,0);
      local_40.isRef = false;
      getTypesForBitwiseOp(__return_storage_ptr__,&local_58,&local_40);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
    }
    else {
      CVar2 = b->category;
      if ((CVar2 & ~primitive) == wrap) {
        uVar4._0_1_ = a->category;
        uVar4._1_1_ = a->arrayElementCategory;
        uVar4._2_1_ = a->isRef;
        uVar4._3_1_ = a->isConstant;
        uVar7 = a->isConstant;
        uVar8 = a->primitiveType;
        local_58.primitiveType.type = uVar8;
        local_58.isConstant = (bool)uVar7;
        local_58.boundingSize = a->boundingSize;
        local_58.arrayElementBoundingSize = a->arrayElementBoundingSize;
        local_58.structure.object = (a->structure).object;
        if (local_58.structure.object != (Structure *)0x0) {
          ((local_58.structure.object)->super_RefCountedObject).refCount =
               ((local_58.structure.object)->super_RefCountedObject).refCount + 1;
        }
        local_58._0_2_ = SUB42(uVar4,0);
        local_58.isRef = false;
        local_40.category = primitive;
        local_40.arrayElementCategory = invalid;
        local_40.isRef = false;
        local_40.isConstant = false;
        local_40.primitiveType.type = int32;
        local_40.boundingSize = 0;
        local_40.arrayElementBoundingSize = 0;
        local_40.structure.object = (Structure *)0x0;
        getTypesForBitwiseOp(__return_storage_ptr__,&local_58,&local_40);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
      }
      else {
        if ((((a->primitiveType).type - int32 < 2) &&
            (((stringLiteral < CVar1 || ((200U >> (CVar1 & 0x1f) & 1) == 0)) &&
             ((b->primitiveType).type - int32 < 2)))) &&
           ((stringLiteral < CVar2 || ((200U >> (CVar2 & 0x1f) & 1) == 0)))) {
          AVar10 = Type::getVectorSize(a);
          AVar11 = Type::getVectorSize(b);
          if ((AVar10 == AVar11) && ((b->category == vector) == (a->category == vector))) {
            local_24.type =
                 ((b->primitiveType).type == int64 || (a->primitiveType).type == int64) + int32;
            if (a->category == vector) {
              AVar10 = Type::getVectorSize(a);
              Type::createVector(&local_58,&local_24,AVar10);
              uVar9 = local_58._0_8_;
              (__return_storage_ptr__->resultType).category = local_58.category;
              (__return_storage_ptr__->resultType).arrayElementCategory =
                   local_58.arrayElementCategory;
              (__return_storage_ptr__->resultType).isRef = local_58.isRef;
              (__return_storage_ptr__->resultType).isConstant = local_58.isConstant;
              local_58.primitiveType.type = SUB84(uVar9,4);
              (__return_storage_ptr__->resultType).primitiveType.type = local_58.primitiveType.type;
              (__return_storage_ptr__->resultType).boundingSize = local_58.boundingSize;
              (__return_storage_ptr__->resultType).arrayElementBoundingSize =
                   local_58.arrayElementBoundingSize;
              (__return_storage_ptr__->resultType).structure.object = local_58.structure.object;
              if (local_58.structure.object == (Structure *)0x0) {
                (__return_storage_ptr__->operandType).category = local_58.category;
                (__return_storage_ptr__->operandType).arrayElementCategory =
                     local_58.arrayElementCategory;
                (__return_storage_ptr__->operandType).isRef = local_58.isRef;
                (__return_storage_ptr__->operandType).isConstant = local_58.isConstant;
                (__return_storage_ptr__->operandType).primitiveType.type =
                     local_58.primitiveType.type;
                (__return_storage_ptr__->operandType).boundingSize = local_58.boundingSize;
                (__return_storage_ptr__->operandType).arrayElementBoundingSize =
                     local_58.arrayElementBoundingSize;
                (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
              }
              else {
                ((local_58.structure.object)->super_RefCountedObject).refCount =
                     ((local_58.structure.object)->super_RefCountedObject).refCount + 1;
                (__return_storage_ptr__->operandType).category = local_58.category;
                (__return_storage_ptr__->operandType).arrayElementCategory =
                     local_58.arrayElementCategory;
                (__return_storage_ptr__->operandType).isRef = local_58.isRef;
                (__return_storage_ptr__->operandType).isConstant = local_58.isConstant;
                (__return_storage_ptr__->operandType).primitiveType.type =
                     local_58.primitiveType.type;
                (__return_storage_ptr__->operandType).boundingSize = local_58.boundingSize;
                (__return_storage_ptr__->operandType).arrayElementBoundingSize =
                     local_58.arrayElementBoundingSize;
                (__return_storage_ptr__->operandType).structure.object = local_58.structure.object;
                ((local_58.structure.object)->super_RefCountedObject).refCount =
                     ((local_58.structure.object)->super_RefCountedObject).refCount + 1;
              }
              RefCountedPtr<soul::Structure>::decIfNotNull(local_58.structure.object);
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->resultType).category = primitive;
            (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
            (__return_storage_ptr__->resultType).isRef = false;
            (__return_storage_ptr__->resultType).isConstant = false;
            (__return_storage_ptr__->resultType).primitiveType.type = local_24.type;
            (__return_storage_ptr__->resultType).boundingSize = 0;
            (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
            (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
            (__return_storage_ptr__->operandType).category = primitive;
            (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
            (__return_storage_ptr__->operandType).isRef = false;
            (__return_storage_ptr__->operandType).isConstant = false;
            (__return_storage_ptr__->operandType).primitiveType.type = local_24.type;
            (__return_storage_ptr__->operandType).boundingSize = 0;
            (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
            (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
            return __return_storage_ptr__;
          }
        }
        (__return_storage_ptr__->operandType).boundingSize = 0;
        (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->operandType).category = invalid;
        (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
        (__return_storage_ptr__->operandType).isRef = false;
        (__return_storage_ptr__->operandType).isConstant = false;
        (__return_storage_ptr__->operandType).primitiveType = invalid;
        (__return_storage_ptr__->resultType).category = invalid;
        (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
        (__return_storage_ptr__->resultType).isRef = false;
        (__return_storage_ptr__->resultType).isConstant = false;
        (__return_storage_ptr__->resultType).primitiveType = invalid;
        (__return_storage_ptr__->resultType).boundingSize = 0;
        (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForBitwiseOp (const Type& a, const Type& b)
    {
        if (a.isReference())  return getTypesForBitwiseOp (a.removeReference(), b);
        if (b.isReference())  return getTypesForBitwiseOp (a, b.removeReference());

        if (a.isBoundedInt())  return getTypesForBitwiseOp (PrimitiveType::int32, b.removeReferenceIfPresent());
        if (b.isBoundedInt())  return getTypesForBitwiseOp (a.removeReferenceIfPresent(), PrimitiveType::int32);

        if (isTypeSuitableForBitwiseOp (a)
             && isTypeSuitableForBitwiseOp (b)
             && a.getVectorSize() == b.getVectorSize()
             && a.isVector() == b.isVector())
        {
            auto intType = (a.isInteger64() || b.isInteger64()) ? PrimitiveType::int64 : PrimitiveType::int32;

            if (! a.isVector())
                return { intType, intType };

            auto vecType = Type::createVector (intType, a.getVectorSize());
            return { vecType, vecType };
        }

        return {};
    }